

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

Element_p __thiscall indigox::Atom::GetElement(Atom *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Element_p EVar1;
  
  std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x28));
  EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Element_p)EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element_p Atom::GetElement() const { return element_; }